

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_measurement.cpp
# Opt level: O0

void __thiscall
fixedPreciseMeasurement_unaryOps_Test::~fixedPreciseMeasurement_unaryOps_Test
          (fixedPreciseMeasurement_unaryOps_Test *this)

{
  fixedPreciseMeasurement_unaryOps_Test *this_local;
  
  ~fixedPreciseMeasurement_unaryOps_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(fixedPreciseMeasurement, unaryOps)
{
    fixed_precise_measurement x(2.0, precise::cm);

    auto z = -x;
    auto y = +x;
    EXPECT_EQ(y, x);
    EXPECT_EQ(z.value(), -x.value());
    EXPECT_EQ(z.units(), x.units());
}